

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  long *flagvalue;
  void *flagvalue_00;
  void *flagvalue_01;
  void *flagvalue_02;
  FILE *__s;
  double dVar3;
  double dVar4;
  int flag;
  SUNContext ctx;
  sunrealtype t;
  double local_a8;
  undefined8 uStack_a0;
  void *arkode_mem;
  long netf;
  long ncfn;
  long nni;
  long nje;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  sunrealtype lamda;
  long nfeLS;
  
  lamda = -100.0;
  arkode_mem = (void *)0x0;
  flag = SUNContext_Create(0,&ctx);
  iVar2 = 1;
  iVar1 = check_flag(&flag,"SUNContext_Create",1);
  if (iVar1 == 0) {
    puts("\nAnalytical ODE test problem:");
    printf("    lamda = %g\n",0xc059000000000000);
    printf("   reltol = %.1e\n",0x3eb0c6f7a0b5ed8d);
    printf("   abstol = %.1e\n\n",0x3ddb7cdfd9d7bdbb);
    flagvalue = (long *)N_VNew_Serial(1,ctx);
    iVar1 = check_flag(flagvalue,"N_VNew_Serial",0);
    if (iVar1 == 0) {
      N_VConst(0,flagvalue);
      flagvalue_00 = (void *)ARKStepCreate(0,0,f,flagvalue,ctx);
      arkode_mem = flagvalue_00;
      iVar1 = check_flag(flagvalue_00,"ARKStepCreate",0);
      if (iVar1 == 0) {
        flag = ARKodeSetUserData(flagvalue_00,&lamda);
        iVar1 = check_flag(&flag,"ARKodeSetUserData",1);
        iVar2 = 1;
        if (iVar1 == 0) {
          flag = ARKodeSStolerances(0x3eb0c6f7a0b5ed8d,0x3ddb7cdfd9d7bdbb,flagvalue_00);
          iVar2 = 1;
          iVar1 = check_flag(&flag,"ARKodeSStolerances",1);
          if (iVar1 == 0) {
            flagvalue_01 = (void *)SUNDenseMatrix(1,1,ctx);
            iVar1 = check_flag(flagvalue_01,"SUNDenseMatrix",0);
            if (iVar1 == 0) {
              flagvalue_02 = (void *)SUNLinSol_Dense(flagvalue,flagvalue_01,ctx);
              iVar1 = check_flag(flagvalue_02,"SUNLinSol_Dense",0);
              if (iVar1 == 0) {
                flag = ARKodeSetLinearSolver(flagvalue_00,flagvalue_02,flagvalue_01);
                iVar1 = check_flag(&flag,"ARKodeSetLinearSolver",1);
                iVar2 = 1;
                if (iVar1 == 0) {
                  flag = ARKodeSetJacFn(flagvalue_00,Jac);
                  iVar1 = check_flag(&flag,"ARKodeSetJacFn",1);
                  iVar2 = 1;
                  if (iVar1 == 0) {
                    flag = ARKodeSetLinear(flagvalue_00,0);
                    iVar1 = check_flag(&flag,"ARKodeSetLinear",1);
                    iVar2 = 1;
                    if (iVar1 == 0) {
                      __s = fopen("solution.txt","w");
                      fwrite("# t u\n",6,1,__s);
                      fprintf(__s," %.16e %.16e\n",0,**(undefined8 **)(*flagvalue + 0x10));
                      t = 0.0;
                      puts("        t           u");
                      puts("   ---------------------");
                      local_a8 = 1.0;
                      dVar3 = 0.0;
                      while (1e-15 < 10.0 - dVar3) {
                        flag = ARKodeEvolve(local_a8,flagvalue_00,flagvalue,&t,1);
                        iVar2 = check_flag(&flag,"ARKodeEvolve",1);
                        if (iVar2 != 0) break;
                        printf("  %10.6f  %10.6f\n",t,**(undefined8 **)(*flagvalue + 0x10));
                        fprintf(__s," %.16e %.16e\n",t,**(undefined8 **)(*flagvalue + 0x10));
                        if (flag < 0) {
                          fwrite("Solver failure, stopping integration\n",0x25,1,_stderr);
                          break;
                        }
                        dVar4 = local_a8 + 1.0;
                        local_a8 = 10.0;
                        dVar3 = t;
                        if (dVar4 <= 10.0) {
                          local_a8 = dVar4;
                        }
                      }
                      puts("   ---------------------");
                      fclose(__s);
                      flag = ARKodeGetNumSteps(flagvalue_00,&nst);
                      check_flag(&flag,"ARKodeGetNumSteps",1);
                      flag = ARKodeGetNumStepAttempts(flagvalue_00,&nst_a);
                      check_flag(&flag,"ARKodeGetNumStepAttempts",1);
                      flag = ARKStepGetNumRhsEvals(flagvalue_00,&nfe,&nfi);
                      check_flag(&flag,"ARKStepGetNumRhsEvals",1);
                      flag = ARKodeGetNumLinSolvSetups(flagvalue_00,&nsetups);
                      check_flag(&flag,"ARKodeGetNumLinSolvSetups",1);
                      flag = ARKodeGetNumErrTestFails(flagvalue_00,&netf);
                      check_flag(&flag,"ARKodeGetNumErrTestFails",1);
                      flag = ARKodeGetNumNonlinSolvIters(flagvalue_00,&nni);
                      check_flag(&flag,"ARKodeGetNumNonlinSolvIters",1);
                      flag = ARKodeGetNumNonlinSolvConvFails(flagvalue_00,&ncfn);
                      check_flag(&flag,"ARKodeGetNumNonlinSolvConvFails",1);
                      flag = ARKodeGetNumJacEvals(flagvalue_00,&nje);
                      check_flag(&flag,"ARKodeGetNumJacEvals",1);
                      flag = ARKodeGetNumLinRhsEvals(flagvalue_00);
                      check_flag(&flag,"ARKodeGetNumLinRhsEvals",1);
                      puts("\nFinal Solver Statistics:");
                      printf("   Internal solver steps = %li (attempted = %li)\n",nst,nst_a);
                      printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",nfe,nfi);
                      printf("   Total linear solver setups = %li\n",nsetups);
                      printf("   Total RHS evals for setting up the linear system = %li\n",nfeLS);
                      printf("   Total number of Jacobian evaluations = %li\n",nje);
                      printf("   Total number of Newton iterations = %li\n",nni);
                      printf("   Total number of linear solver convergence failures = %li\n",ncfn);
                      printf("   Total number of error test failures = %li\n\n",netf);
                      dVar3 = atan(t);
                      local_a8 = ABS(**(double **)(*flagvalue + 0x10) - dVar3) *
                                 (1.0 / (ABS(dVar3) * 1e-06 + 1e-10));
                      uStack_a0 = 0;
                      if (1.0 <= local_a8) {
                        fprintf(_stdout,"\nSUNDIALS_WARNING: check_ans error=%g\n\n",local_a8);
                      }
                      flag = (int)(1.0 <= local_a8);
                      N_VDestroy(flagvalue);
                      ARKodeFree(&arkode_mem);
                      SUNLinSolFree(flagvalue_02);
                      SUNMatDestroy(flagvalue_01);
                      SUNContext_Free(&ctx);
                      iVar2 = flag;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);    /* initial time */
  sunrealtype Tf     = SUN_RCONST(10.0);   /* final time */
  sunrealtype dTout  = SUN_RCONST(1.0);    /* time between outputs */
  sunindextype NEQ   = 1;                  /* number of dependent vars. */
  sunrealtype reltol = SUN_RCONST(1.0e-6); /* tolerances */
  sunrealtype abstol = SUN_RCONST(1.0e-10);
  sunrealtype lamda  = SUN_RCONST(-100.0); /* stiffness parameter */

  /* general problem variables */
  int flag;                  /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  SUNMatrix A        = NULL; /* empty matrix for linear solver */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKode memory structure */
  FILE* UFID;
  sunrealtype t, tout;
  long int nst, nst_a, nfe, nfi, nsetups, nje, nfeLS, nni, ncfn, netf;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Initial diagnostics output */
  printf("\nAnalytical ODE test problem:\n");
  printf("    lamda = %" GSYM "\n", lamda);
  printf("   reltol = %.1" ESYM "\n", reltol);
  printf("   abstol = %.1" ESYM "\n\n", abstol);

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  N_VConst(SUN_RCONST(0.0), y); /* Specify initial condition */

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the inital time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetUserData(arkode_mem,
                           (void*)&lamda); /* Pass lamda to user functions */
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }
  flag = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  /* Initialize dense matrix data structure and solver */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_flag((void*)A, "SUNDenseMatrix", 0)) { return 1; }
  LS = SUNLinSol_Dense(y, A, ctx);
  if (check_flag((void*)LS, "SUNLinSol_Dense", 0)) { return 1; }

  /* Linear solver interface */
  flag = ARKodeSetLinearSolver(arkode_mem, LS,
                               A); /* Attach matrix and linear solver */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
  flag = ARKodeSetJacFn(arkode_mem, Jac); /* Set Jacobian routine */
  if (check_flag(&flag, "ARKodeSetJacFn", 1)) { return 1; }

  /* Specify linearly implicit RHS, with non-time-dependent Jacobian */
  flag = ARKodeSetLinear(arkode_mem, 0);
  if (check_flag(&flag, "ARKodeSetLinear", 1)) { return 1; }

  /* Open output stream for results, output comment line */
  UFID = fopen("solution.txt", "w");
  fprintf(UFID, "# t u\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM "\n", T0, NV_Ith_S(y, 0));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u\n");
  printf("   ---------------------\n");
  while (Tf - t > 1.0e-15)
  {
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
    printf("  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(y, 0)); /* access/print solution */
    fprintf(UFID, " %.16" ESYM " %.16" ESYM "\n", t, NV_Ith_S(y, 0));
    if (flag >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ---------------------\n");
  fclose(UFID);

  /* Get/print some final statistics on how the solve progressed */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(&flag, "ARKStepGetNumRhsEvals", 1);
  flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_flag(&flag, "ARKodeGetNumLinSolvSetups", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);
  flag = ARKodeGetNumJacEvals(arkode_mem, &nje);
  check_flag(&flag, "ARKodeGetNumJacEvals", 1);
  flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_flag(&flag, "ARKodeGetNumLinRhsEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of linear solver convergence failures = %li\n", ncfn);
  printf("   Total number of error test failures = %li\n\n", netf);

  /* check the solution error */
  flag = check_ans(y, t, reltol, abstol);

  /* Clean up and return */
  N_VDestroy(y);           /* Free y vector */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNMatDestroy(A);        /* Free A matrix */
  SUNContext_Free(&ctx);   /* Free context */

  return flag;
}